

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::CompareSessionIDs(V2TransportTester *this)

{
  array<std::byte,_32UL> *paVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  Info info;
  check_type cVar6;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  char **local_f8;
  assertion_result local_f0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  lazy_ostream local_88;
  undefined1 local_78 [30];
  Info local_5a;
  long local_38;
  
  local_f0.m_message.pn.pi_ = (sp_counted_base *)local_f0.m_message.px;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  V2Transport::GetInfo(&local_5a,&this->m_transport);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x52c;
  file.m_begin = (iterator)&local_98;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a8,msg);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_engaged;
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "info.session_id";
  local_f0.m_message.px = (element_type *)0xedffe8;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_78._8_8_ = &local_f0;
  local_78._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_b0 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_88,1,0,WARN,_cVar6,(size_t)&local_b8,0x52c);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x52d;
  file_00.m_begin = (iterator)&local_c8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  paVar1 = &(this->m_cipher).m_session_id;
  local_88._vptr_lazy_ostream = *(_func_int ***)paVar1->_M_elems;
  local_88.m_empty = (bool)(this->m_cipher).m_session_id._M_elems[8];
  local_88._9_1_ = (this->m_cipher).m_session_id._M_elems[9];
  local_88._10_1_ = (this->m_cipher).m_session_id._M_elems[10];
  local_88._11_1_ = (this->m_cipher).m_session_id._M_elems[0xb];
  local_88._12_1_ = (this->m_cipher).m_session_id._M_elems[0xc];
  local_88._13_1_ = (this->m_cipher).m_session_id._M_elems[0xd];
  local_88._14_1_ = (this->m_cipher).m_session_id._M_elems[0xe];
  local_88._15_1_ = (this->m_cipher).m_session_id._M_elems[0xf];
  local_78._0_16_ = *(undefined1 (*) [16])((this->m_cipher).m_session_id._M_elems + 0x10);
  auVar5[0] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x10] == local_78[0]);
  auVar5[1] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x11] == local_78[1]);
  auVar5[2] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x12] == local_78[2]);
  auVar5[3] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x13] == local_78[3]);
  auVar5[4] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x14] == local_78[4]);
  auVar5[5] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x15] == local_78[5]);
  auVar5[6] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x16] == local_78[6]);
  auVar5[7] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x17] == local_78[7]);
  auVar5[8] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x18] == local_78[8]);
  auVar5[9] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0x19] == local_78[9]);
  auVar5[10] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                 m_data._M_elems[0x1a] == local_78[10]);
  auVar5[0xb] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0x1b] == local_78[0xb]);
  auVar5[0xc] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0x1c] == local_78[0xc]);
  auVar5[0xd] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0x1d] == local_78[0xd]);
  auVar5[0xe] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0x1e] == local_78[0xe]);
  auVar5[0xf] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0x1f] == local_78[0xf]);
  auVar4[0] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[0] == paVar1->_M_elems[0]);
  auVar4[1] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[1] == (this->m_cipher).m_session_id._M_elems[1]);
  auVar4[2] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[2] == (this->m_cipher).m_session_id._M_elems[2]);
  auVar4[3] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[3] == (this->m_cipher).m_session_id._M_elems[3]);
  auVar4[4] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[4] == (this->m_cipher).m_session_id._M_elems[4]);
  auVar4[5] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[5] == (this->m_cipher).m_session_id._M_elems[5]);
  auVar4[6] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[6] == (this->m_cipher).m_session_id._M_elems[6]);
  auVar4[7] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[7] == (this->m_cipher).m_session_id._M_elems[7]);
  auVar4[8] = -((bool)local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[8] == local_88.m_empty);
  auVar4[9] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                m_data._M_elems[9] == local_88._9_1_);
  auVar4[10] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                 m_data._M_elems[10] == local_88._10_1_);
  auVar4[0xb] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0xb] == local_88._11_1_);
  auVar4[0xc] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0xc] == local_88._12_1_);
  auVar4[0xd] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0xd] == local_88._13_1_);
  auVar4[0xe] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0xe] == local_88._14_1_);
  auVar4[0xf] = -(local_5a.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
                  super__Optional_payload_base<uint256>._M_payload._M_value.super_base_blob<256U>.
                  m_data._M_elems[0xf] == local_88._15_1_);
  auVar4 = auVar4 & auVar5;
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = &local_120;
  local_120 = "uint256(MakeUCharSpan(m_cipher.GetSessionID())) == *info.session_id";
  local_118 = "";
  local_110.m_message.px = (element_type *)(local_110.m_message._1_8_ << 8);
  local_110._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&local_110,1,0,WARN,0xedd732,(size_t)&stack0xfffffffffffffed0
             ,0x52d);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CompareSessionIDs() const
    {
        auto info = m_transport.GetInfo();
        BOOST_CHECK(info.session_id);
        BOOST_CHECK(uint256(MakeUCharSpan(m_cipher.GetSessionID())) == *info.session_id);
    }